

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O0

void __thiscall bandit::reporter::info::context_starting(info *this,string *desc)

{
  size_type sVar1;
  string *desc_local;
  info *this_local;
  
  progress_base::context_starting((progress_base *)this,desc);
  std::
  stack<bandit::reporter::info::context_info,std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>>
  ::emplace<std::__cxx11::string_const&>
            ((stack<bandit::reporter::info::context_info,std::deque<bandit::reporter::info::context_info,std::allocator<bandit::reporter::info::context_info>>>
              *)&this->context_stack_,desc);
  sVar1 = std::
          stack<bandit::reporter::info::context_info,_std::deque<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>_>
          ::size(&this->context_stack_);
  if (sVar1 == 1) {
    output_context_start_message(this);
  }
  else {
    this->not_yet_shown_ = this->not_yet_shown_ + 1;
  }
  return;
}

Assistant:

void context_starting(const std::string& desc) override {
        progress_base::context_starting(desc);
        context_stack_.emplace(desc);
        if (context_stack_.size() == 1) {
          output_context_start_message();
        } else {
          ++not_yet_shown_;
        }
      }